

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall
InvalidIndex_InsertIntoIndexAtWrongRevision_Test::TestBody
          (InvalidIndex_InsertIntoIndexAtWrongRevision_Test *this)

{
  database *db;
  bool bVar1;
  pointer *__ptr;
  undefined1 *puVar2;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  r1index;
  TrueWithString gtest_msg;
  transaction_type t2;
  shared_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  r0index;
  transaction_type t1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  extent<char> local_2a8;
  undefined4 local_28c;
  extent<char> local_288;
  long local_278 [2];
  undefined1 local_268 [8];
  database *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  mutex_type *local_240;
  bool local_238;
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  *local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  undefined1 local_220 [48];
  bool local_1f0;
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_false>
  local_138;
  undefined1 local_128 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_*,_false>
  local_40;
  
  db = &(this->super_InvalidIndex).super_IndexFixture.db_;
  puVar2 = &(this->super_InvalidIndex).super_IndexFixture.field_0x10;
  local_260 = (database *)((ulong)local_260 & 0xffffffffffffff00);
  local_268 = (undefined1  [8])puVar2;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_268);
  local_260._0_1_ = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_220,db,
             (unique_lock<mock_mutex> *)local_268);
  if ((local_260._0_1_ == true) && (local_268 != (undefined1  [8])0x0)) {
    local_260._0_1_ = false;
  }
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&local_2c8,db,true);
  local_258._M_allocated_capacity._0_4_ = 0x3179656b;
  local_260 = (database *)&DAT_00000004;
  local_258._M_allocated_capacity._4_4_ = local_258._M_allocated_capacity._4_4_ & 0xffffff00;
  local_288.addr.a_.a_ = (address)0;
  local_288.size = 0;
  local_268 = (undefined1  [8])&local_258;
  pstore::index::
  hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
  ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_128,
             (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              *)local_2c8._M_dataplus._M_p,(transaction_base *)local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
             &local_288);
  if (local_40._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                  *)&local_40,local_40._M_head_impl);
  }
  local_40._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
        *)0x0;
  if (local_268 != (undefined1  [8])&local_258) {
    operator_delete((void *)local_268,
                    CONCAT44(local_258._M_allocated_capacity._4_4_,
                             local_258._M_allocated_capacity._0_4_) + 1);
  }
  pstore::transaction_base::commit((transaction_base *)local_220);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length);
  }
  local_220._0_8_ = &PTR__transaction_00271290;
  pstore::transaction_base::rollback((transaction_base *)local_220);
  if ((local_1f0 == true) && ((internal_node *)local_220._40_8_ != (internal_node *)0x0)) {
    local_1f0 = false;
  }
  pstore::database::sync(db);
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
            ((index *)&local_230,db,true);
  local_220[8] = false;
  local_220._0_8_ = puVar2;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_220);
  local_220[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_268,db,(lock_type *)local_220);
  if (((bool)local_220[8] == true) &&
     ((database_reference)local_220._0_8_ != (database_reference)0x0)) {
    local_220[8] = false;
  }
  pstore::get_error_category();
  local_28c = 8;
  local_278[1] = 0;
  local_288.size = 0;
  local_278[0] = 0;
  local_288.addr.a_.a_ = (address)(address)local_278;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_2c8.field_2._M_allocated_capacity._0_4_ = 0x3279656b;
    local_2c8._M_string_length = (size_type)&DAT_00000004;
    local_2c8.field_2._M_allocated_capacity._4_4_ =
         local_2c8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_2a8.addr.a_.a_ = (address)0;
    local_2a8.size = 0;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    pstore::index::
    hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
    ::insert_or_assign<std::__cxx11::string,pstore::extent<char>,void>
              ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
                *)local_220,local_230,(transaction_base *)local_268,&local_2c8,&local_2a8);
    if (local_138._M_head_impl !=
        (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
         *)0x0) {
      std::
      default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
      ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>
                    *)&local_138,local_138._M_head_impl);
    }
    local_138._M_head_impl =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
          *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,
                      CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                               local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_288,0,(char *)local_288.size,0x20ade2);
  testing::Message::Message((Message *)&local_2c8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_2a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)local_288.addr.a_.a_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)&local_2c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
  if ((hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
       *)local_2c8._M_dataplus._M_p !=
      (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
       *)0x0) {
    (**(code **)(*(size_type *)local_2c8._M_dataplus._M_p + 8))();
  }
  if (local_288.addr.a_.a_ != (address)local_278) {
    operator_delete((void *)local_288.addr.a_.a_,local_278[0] + 1);
  }
  local_268 = (undefined1  [8])&PTR__transaction_00271290;
  pstore::transaction_base::rollback((transaction_base *)local_268);
  if ((local_238 == true) && (local_240 != (mutex_type *)0x0)) {
    local_238 = false;
  }
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
  }
  return;
}

Assistant:

TEST_F (InvalidIndex, InsertIntoIndexAtWrongRevision) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        auto r1index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
        r1index->insert_or_assign (t1, "key1"s, pstore::extent<char> ());
        t1.commit ();
    }
    db_.sync (0);
    auto r0index = pstore::index::get_index<pstore::trailer::indices::write> (db_);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});

        // We're now synced to revision 1. Trying to insert into the index loaded from
        // r0 should raise an error.
        check_for_error (
            [&] () { r0index->insert_or_assign (t2, "key2"s, pstore::extent<char> ()); },
            pstore::error_code::index_not_latest_revision);
    }
}